

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_test.cc
# Opt level: O0

void intgemm::kernel_quantize_test<(intgemm::CPUType)4>(void)

{
  longlong alVar1 [8];
  vector_t<CPUType::AVX512BW,_float> quant_mult_00;
  vector_t<CPUType::AVX512BW,_float> input_00;
  ulong uVar2;
  float *__first;
  float *__last;
  float (*pafVar3) [16];
  longlong (*palVar4) [8];
  size_t sVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  AssertionHandler catchAssertionHandler;
  size_t i;
  __m512 quant_mult;
  AlignedVector<int> output;
  AlignedVector<float> input;
  undefined1 auVar10 [48];
  undefined1 in_stack_fffffffffffffc40 [64];
  float to;
  undefined1 auVar9 [64];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 in_stack_fffffffffffffdc0 [32];
  undefined8 uVar19;
  SourceLineInfo local_1b0;
  StringRef local_1a0;
  ulong local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  AlignedVector<int> local_70;
  AlignedVector<float> local_60 [5];
  
  auVar10 = in_stack_fffffffffffffc40._52_48_;
  if (3 < kCPU) {
    uVar19 = 0x10;
    AlignedVector<float>::AlignedVector
              (in_stack_fffffffffffffc40._24_8_,in_stack_fffffffffffffc40._16_8_,
               in_stack_fffffffffffffc40._8_8_);
    to = auVar10._44_4_;
    AlignedVector<int>::AlignedVector(auVar10._16_8_,auVar10._8_8_,auVar10._0_8_);
    __first = AlignedVector<float>::begin(local_60);
    __last = AlignedVector<float>::end(local_60);
    std::iota<float*,float>(__first,__last,0.0);
    auVar8 = ZEXT464(0x40000000);
    set1_ps<float__vector(16)>(to);
    uVar11 = auVar8._0_8_;
    uVar12 = auVar8._8_8_;
    uVar13 = auVar8._16_8_;
    uVar14 = auVar8._24_8_;
    uVar15 = auVar8._32_8_;
    uVar16 = auVar8._40_8_;
    uVar17 = auVar8._48_8_;
    uVar18 = auVar8._56_8_;
    local_c0 = uVar11;
    uStack_b8 = uVar12;
    uStack_b0 = uVar13;
    uStack_a8 = uVar14;
    uStack_a0 = uVar15;
    uStack_98 = uVar16;
    uStack_90 = uVar17;
    uStack_88 = uVar18;
    pafVar3 = AlignedVector<float>::as<float__vector(16)>(local_60);
    local_100 = *(undefined8 *)*pafVar3;
    uStack_f8 = *(undefined8 *)(*pafVar3 + 2);
    uStack_f0 = *(undefined8 *)(*pafVar3 + 4);
    uStack_e8 = *(undefined8 *)(*pafVar3 + 6);
    uStack_e0 = *(undefined8 *)(*pafVar3 + 8);
    uStack_d8 = *(undefined8 *)(*pafVar3 + 10);
    uStack_d0 = *(undefined8 *)(*pafVar3 + 0xc);
    uStack_c8 = *(undefined8 *)(*pafVar3 + 0xe);
    local_140 = local_c0;
    uStack_138 = uStack_b8;
    uStack_130 = uStack_b0;
    uStack_128 = uStack_a8;
    uStack_120 = uStack_a0;
    uStack_118 = uStack_98;
    uStack_110 = uStack_90;
    uStack_108 = uStack_88;
    auVar8._8_8_ = uStack_b8;
    auVar8._0_8_ = local_c0;
    auVar8._16_8_ = uStack_b0;
    auVar8._24_8_ = uStack_a8;
    auVar8._32_8_ = uStack_a0;
    auVar8._40_8_ = uStack_98;
    auVar8._48_8_ = uStack_90;
    auVar8._56_8_ = uStack_88;
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar6 = vmovdqa64_avx512f((undefined1  [64])*pafVar3);
    auVar9 = vmovdqa64_avx512f(auVar6);
    input_00[2] = (float)in_stack_fffffffffffffdc0._0_4_;
    input_00[3] = (float)in_stack_fffffffffffffdc0._4_4_;
    input_00[4] = (float)in_stack_fffffffffffffdc0._8_4_;
    input_00[5] = (float)in_stack_fffffffffffffdc0._12_4_;
    input_00[6] = (float)in_stack_fffffffffffffdc0._16_4_;
    input_00[7] = (float)in_stack_fffffffffffffdc0._20_4_;
    input_00[8] = (float)in_stack_fffffffffffffdc0._24_4_;
    input_00[9] = (float)in_stack_fffffffffffffdc0._28_4_;
    input_00[0] = (float)(int)uVar18;
    input_00[1] = (float)(int)((ulong)uVar18 >> 0x20);
    input_00._40_8_ = __last;
    input_00._48_8_ = __first;
    input_00[0xe] = (float)(int)uVar19;
    input_00[0xf] = (float)(int)((ulong)uVar19 >> 0x20);
    quant_mult_00[2] = (float)(int)uVar11;
    quant_mult_00[3] = (float)(int)((ulong)uVar11 >> 0x20);
    quant_mult_00._0_8_ = pafVar3;
    quant_mult_00[4] = (float)(int)uVar12;
    quant_mult_00[5] = (float)(int)((ulong)uVar12 >> 0x20);
    quant_mult_00[6] = (float)(int)uVar13;
    quant_mult_00[7] = (float)(int)((ulong)uVar13 >> 0x20);
    quant_mult_00[8] = (float)(int)uVar14;
    quant_mult_00[9] = (float)(int)((ulong)uVar14 >> 0x20);
    quant_mult_00[10] = (float)(int)uVar15;
    quant_mult_00[0xb] = (float)(int)((ulong)uVar15 >> 0x20);
    quant_mult_00[0xc] = (float)(int)uVar16;
    quant_mult_00[0xd] = (float)(int)((ulong)uVar16 >> 0x20);
    quant_mult_00[0xe] = (float)(int)uVar17;
    quant_mult_00[0xf] = (float)(int)((ulong)uVar17 >> 0x20);
    kernels::quantize(input_00,quant_mult_00);
    palVar4 = AlignedVector<int>::as<long_long__vector(8)>(&local_70);
    alVar1 = (longlong  [8])vmovdqa64_avx512f(auVar6);
    *palVar4 = alVar1;
    local_148 = 0;
    while( true ) {
      uVar2 = local_148;
      auVar7 = auVar6._0_16_;
      sVar5 = AlignedVector<int>::size(&local_70);
      if (sVar5 <= uVar2) break;
      local_1a0 = operator____catch_sr(auVar9._8_8_,auVar9._0_8_);
      Catch::SourceLineInfo::SourceLineInfo
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/quantize_test.cc"
                 ,0x19);
      Catch::StringRef::StringRef(auVar9._24_8_,auVar9._16_8_);
      Catch::AssertionHandler::AssertionHandler
                (auVar9._24_8_,auVar9._16_8_,auVar9._8_8_,auVar9._32_16_,auVar9._4_4_);
      AlignedVector<int>::operator[](&local_70,local_148);
      Catch::Decomposer::operator<=(auVar9._0_8_,(int *)0x275055);
      auVar7 = vcvtusi2ss_avx512f(auVar7,local_148);
      auVar6 = ZEXT464((uint)(auVar7._0_4_ + auVar7._0_4_));
      Catch::ExprLhs<int_const&>::operator==(auVar8._0_8_,auVar9._56_8_);
      Catch::AssertionHandler::handleExpr(auVar9._8_8_,auVar9._0_8_);
      Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
                ((BinaryExpr<const_int_&,_const_int_&> *)0x2750c9);
      Catch::AssertionHandler::complete(auVar9._8_8_);
      Catch::AssertionHandler::~AssertionHandler(auVar9._8_8_);
      local_148 = local_148 + 1;
    }
    AlignedVector<int>::~AlignedVector((AlignedVector<int> *)0x2751e4);
    AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x2751f1);
  }
  return;
}

Assistant:

void kernel_quantize_test() {
  if (kCPU < CPUType_)
    return;

  using input_vec_t = vector_t<CPUType_, float>;
  using output_vec_t = vector_t<CPUType_, int>;

  AlignedVector<float> input(sizeof(input_vec_t) / sizeof(float));
  AlignedVector<int> output(sizeof(output_vec_t) / sizeof(int));

  std::iota(input.begin(), input.end(), 0.0f);
  auto quant_mult = set1_ps<input_vec_t>(2.f);

  *output.template as<output_vec_t>() = kernels::quantize(*input.template as<input_vec_t>(), quant_mult);
  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == int(i*2.f));
}